

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

int __thiscall ncnn::Normalize::forward(Normalize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  float fVar3;
  double dVar4;
  int i_8;
  float scale_4;
  float *outptr_4;
  float *ptr_7;
  int q_8;
  float *ptr_6;
  int q_7;
  float ssum_4;
  int i_7;
  int i_6;
  float *outptr_3;
  float *ptr_5;
  int q_6;
  float *ptr_4;
  int q_5;
  float ssum_3;
  int i_5;
  float scale_3;
  Mat square_sum_blob_1;
  int i_4;
  float scale_2;
  float a_1;
  int i_3;
  float ssum_2;
  float *outptr_2;
  float *ptr_3;
  int q_4;
  int i_2;
  float scale_1;
  float *outptr_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *outptr;
  float *ptr_1;
  int q_2;
  float scale;
  float a;
  int q_1;
  float ssum;
  int i;
  float ssum_1;
  float *ptr;
  int q;
  Mat square_sum_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffa20;
  float in_stack_fffffffffffffa24;
  Mat *in_stack_fffffffffffffa28;
  size_t in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  int _w;
  Mat *in_stack_fffffffffffffa40;
  float local_540;
  int local_498;
  Mat local_490;
  float *local_458;
  Mat local_450;
  float *local_418;
  int local_40c;
  Mat local_408;
  float *local_3d0;
  int local_3c8;
  float local_3c4;
  int local_3c0;
  int local_3bc;
  Mat local_3b8;
  float *local_380;
  Mat local_378;
  float *local_340;
  int local_334;
  Mat local_330;
  float *local_2f8;
  int local_2f0;
  float local_2ec;
  int local_2e8;
  float local_2e4;
  Mat local_2e0;
  int local_2a4;
  float local_2a0;
  float local_29c;
  int local_298;
  float local_294;
  Mat local_290;
  float *local_258;
  Mat local_250;
  float *local_218;
  int local_20c;
  int local_208;
  float local_204;
  Mat local_200;
  float *local_1c8;
  Mat local_1c0;
  float *local_188;
  int local_180;
  int local_17c;
  Mat local_178;
  float *local_140;
  Mat local_138;
  float *local_100;
  int local_f4;
  float local_f0;
  float local_ec;
  int local_e8;
  float local_e4;
  int local_e0;
  float local_dc;
  Mat local_d8;
  float *local_a0;
  int local_94;
  undefined4 local_90;
  Mat local_80;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = *(int *)(in_RSI + 0x28);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = local_2c * local_30;
  Mat::create(in_stack_fffffffffffffa40,(int)((ulong)in_stack_fffffffffffffa38 >> 0x20),
              (int)in_stack_fffffffffffffa38,(int)(in_stack_fffffffffffffa30 >> 0x20),
              (size_t)in_stack_fffffffffffffa28,
              (Allocator *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  _w = (int)((ulong)in_stack_fffffffffffffa38 >> 0x20);
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  if (bVar1) {
    local_4 = -100;
  }
  else if ((*(int *)(in_RDI + 0x80) == 0) || (*(int *)(in_RDI + 0x84) == 0)) {
    if ((*(int *)(in_RDI + 0x80) == 0) || (*(int *)(in_RDI + 0x84) != 0)) {
      if ((*(int *)(in_RDI + 0x80) == 0) && (*(int *)(in_RDI + 0x84) != 0)) {
        Mat::Mat(&local_2e0);
        Mat::create(in_stack_fffffffffffffa40,_w,in_stack_fffffffffffffa30,
                    (Allocator *)in_stack_fffffffffffffa28);
        bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        if (bVar1) {
          local_4 = -100;
        }
        else {
          if (*(int *)(in_RDI + 0x88) == 0) {
            for (local_3c0 = 0; local_3c0 < local_44; local_3c0 = local_3c0 + 1) {
              local_3c4 = *(float *)(in_RDI + 0x8c);
              for (local_3c8 = 0; local_3c8 < local_34; local_3c8 = local_3c8 + 1) {
                Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
                pfVar2 = Mat::operator_cast_to_float_(&local_408);
                Mat::~Mat((Mat *)0x14acb2);
                local_3c4 = pfVar2[local_3c0] * pfVar2[local_3c0] + local_3c4;
                local_3d0 = pfVar2;
              }
              dVar4 = std::sqrt((double)(ulong)(uint)local_3c4);
              pfVar2 = Mat::operator[](&local_2e0,local_3c0);
              *pfVar2 = 1.0 / SUB84(dVar4,0);
            }
            for (local_40c = 0; local_40c < local_34; local_40c = local_40c + 1) {
              Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
              pfVar2 = Mat::operator_cast_to_float_(&local_450);
              Mat::~Mat((Mat *)0x14ae03);
              local_418 = pfVar2;
              Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
              pfVar2 = Mat::operator_cast_to_float_(&local_490);
              Mat::~Mat((Mat *)0x14ae4f);
              local_458 = pfVar2;
              pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),local_40c);
              fVar3 = *pfVar2;
              for (local_498 = 0; local_498 < local_44; local_498 = local_498 + 1) {
                in_stack_fffffffffffffa24 = local_418[local_498];
                in_stack_fffffffffffffa28 = (Mat *)Mat::operator[](&local_2e0,local_498);
                local_458[local_498] =
                     in_stack_fffffffffffffa24 * *(float *)&in_stack_fffffffffffffa28->data * fVar3;
              }
            }
          }
          else {
            pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
            local_2e4 = *pfVar2;
            for (local_2e8 = 0; local_2e8 < local_44; local_2e8 = local_2e8 + 1) {
              local_2ec = *(float *)(in_RDI + 0x8c);
              for (local_2f0 = 0; local_2f0 < local_34; local_2f0 = local_2f0 + 1) {
                Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
                pfVar2 = Mat::operator_cast_to_float_(&local_330);
                Mat::~Mat((Mat *)0x14a96c);
                local_2ec = pfVar2[local_2e8] * pfVar2[local_2e8] + local_2ec;
                local_2f8 = pfVar2;
              }
              dVar4 = std::sqrt((double)(ulong)(uint)local_2ec);
              fVar3 = (1.0 / SUB84(dVar4,0)) * local_2e4;
              pfVar2 = Mat::operator[](&local_2e0,local_2e8);
              *pfVar2 = fVar3;
            }
            for (local_334 = 0; local_334 < local_34; local_334 = local_334 + 1) {
              Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
              pfVar2 = Mat::operator_cast_to_float_(&local_378);
              Mat::~Mat((Mat *)0x14aad3);
              local_340 = pfVar2;
              Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
              pfVar2 = Mat::operator_cast_to_float_(&local_3b8);
              Mat::~Mat((Mat *)0x14ab1f);
              local_380 = pfVar2;
              for (local_3bc = 0; local_3bc < local_44; local_3bc = local_3bc + 1) {
                fVar3 = local_340[local_3bc];
                pfVar2 = Mat::operator[](&local_2e0,local_3bc);
                local_380[local_3bc] = fVar3 * *pfVar2;
              }
            }
          }
          local_4 = 0;
        }
        local_90 = 1;
        Mat::~Mat((Mat *)0x14afa6);
      }
      else {
        local_4 = 0;
      }
    }
    else {
      for (local_20c = 0; local_20c < local_34; local_20c = local_20c + 1) {
        Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
        pfVar2 = Mat::operator_cast_to_float_(&local_250);
        Mat::~Mat((Mat *)0x14a550);
        local_218 = pfVar2;
        Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
        pfVar2 = Mat::operator_cast_to_float_(&local_290);
        Mat::~Mat((Mat *)0x14a5a8);
        local_294 = *(float *)(in_RDI + 0x8c);
        for (local_298 = 0; local_298 < local_44; local_298 = local_298 + 1) {
          local_294 = local_218[local_298] * local_218[local_298] + local_294;
        }
        local_258 = pfVar2;
        dVar4 = std::sqrt((double)(ulong)(uint)local_294);
        fVar3 = 1.0 / SUB84(dVar4,0);
        local_29c = fVar3;
        if (*(int *)(in_RDI + 0x88) == 0) {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),local_20c);
          local_540 = *pfVar2;
        }
        else {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
          local_540 = *pfVar2;
        }
        local_2a0 = fVar3 * local_540;
        for (local_2a4 = 0; local_2a4 < local_44; local_2a4 = local_2a4 + 1) {
          local_258[local_2a4] = local_218[local_2a4] * local_2a0;
        }
      }
      local_4 = 0;
    }
  }
  else {
    Mat::Mat(&local_80);
    Mat::create(in_stack_fffffffffffffa40,_w,in_stack_fffffffffffffa30,
                (Allocator *)in_stack_fffffffffffffa28);
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_94 = 0; local_94 < local_34; local_94 = local_94 + 1) {
        Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
        pfVar2 = Mat::operator_cast_to_float_(&local_d8);
        Mat::~Mat((Mat *)0x149ef1);
        local_dc = 0.0;
        for (local_e0 = 0; fVar3 = local_dc, local_e0 < local_44; local_e0 = local_e0 + 1) {
          local_dc = pfVar2[local_e0] * pfVar2[local_e0] + local_dc;
        }
        local_a0 = pfVar2;
        pfVar2 = Mat::operator[](&local_80,local_94);
        *pfVar2 = fVar3;
      }
      local_e4 = *(float *)(in_RDI + 0x8c);
      for (local_e8 = 0; local_e8 < local_34; local_e8 = local_e8 + 1) {
        pfVar2 = Mat::operator[](&local_80,local_e8);
        local_e4 = *pfVar2 + local_e4;
      }
      dVar4 = std::sqrt((double)(ulong)(uint)local_e4);
      fVar3 = 1.0 / SUB84(dVar4,0);
      local_ec = fVar3;
      if (*(int *)(in_RDI + 0x88) == 0) {
        for (local_180 = 0; local_180 < local_34; local_180 = local_180 + 1) {
          Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
          pfVar2 = Mat::operator_cast_to_float_(&local_1c0);
          Mat::~Mat((Mat *)0x14a309);
          local_188 = pfVar2;
          Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
          pfVar2 = Mat::operator_cast_to_float_(&local_200);
          Mat::~Mat((Mat *)0x14a35b);
          fVar3 = local_ec;
          local_1c8 = pfVar2;
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),local_180);
          local_204 = fVar3 * *pfVar2;
          for (local_208 = 0; local_208 < local_44; local_208 = local_208 + 1) {
            local_1c8[local_208] = local_188[local_208] * local_204;
          }
        }
      }
      else {
        pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
        local_f0 = fVar3 * *pfVar2;
        for (local_f4 = 0; local_f4 < local_34; local_f4 = local_f4 + 1) {
          Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
          pfVar2 = Mat::operator_cast_to_float_(&local_138);
          Mat::~Mat((Mat *)0x14a178);
          local_100 = pfVar2;
          Mat::channel(in_stack_fffffffffffffa28,(int)in_stack_fffffffffffffa24);
          pfVar2 = Mat::operator_cast_to_float_(&local_178);
          Mat::~Mat((Mat *)0x14a1ca);
          for (local_17c = 0; local_17c < local_44; local_17c = local_17c + 1) {
            pfVar2[local_17c] = local_100[local_17c] * local_f0;
          }
          local_140 = pfVar2;
        }
      }
      local_4 = 0;
    }
    local_90 = 1;
    Mat::~Mat((Mat *)0x14a4a8);
  }
  return local_4;
}

Assistant:

int Normalize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        // sum + eps
        float ssum = eps;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        // 1 / sqrt(ssum)
        float a = 1.f / sqrt(ssum);

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            float ssum = eps;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a = 1.f / sqrt(ssum);
            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum) * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}